

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O0

void TTD::NSLogEvents::JsRTByteBufferAction_Parse<(TTD::NSLogEvents::EventKind)39>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  uint uVar1;
  uint32 uVar2;
  int iVar3;
  JsRTByteBufferAction *pJVar4;
  TTDVar pvVar5;
  FileReader *reader_00;
  byte *local_40;
  uint local_38;
  uint32 i;
  bool badValue;
  JsRTByteBufferAction *bufferAction;
  UnlinkableSlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  EventLogEntry *evt_local;
  
  pJVar4 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTByteBufferAction,(TTD::NSLogEvents::EventKind)39>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar5 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_00);
  pJVar4->Result = pvVar5;
  uVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  uVar2 = FileReader::ReadLengthValue(reader,true);
  pJVar4->Length = uVar2;
  pJVar4->Buffer = (byte *)0x0;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  if ((uVar1 & 1) == 0) {
    if (pJVar4->Length == 0) {
      local_40 = (byte *)0x0;
    }
    else {
      local_40 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_char>(alloc,(ulong)pJVar4->Length)
      ;
    }
    pJVar4->Buffer = local_40;
    for (local_38 = 0; local_38 < pJVar4->Length; local_38 = local_38 + 1) {
      iVar3 = (*reader->_vptr_FileReader[9])(reader,(ulong)(local_38 != 0));
      pJVar4->Buffer[local_38] = (byte)iVar3;
    }
    (*reader->_vptr_FileReader[5])();
  }
  return;
}

Assistant:

void JsRTByteBufferAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTByteBufferAction* bufferAction = GetInlineEventDataAs<JsRTByteBufferAction, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            bufferAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            bool badValue = reader->ReadBool(NSTokens::Key::boolVal, true);

            bufferAction->Length = reader->ReadLengthValue(true);
            bufferAction->Buffer = nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            if(!badValue)
            {
                bufferAction->Buffer = (bufferAction->Length != 0) ? alloc.SlabAllocateArray<byte>(bufferAction->Length) : nullptr;

                for(uint32 i = 0; i < bufferAction->Length; ++i)
                {
                    bufferAction->Buffer[i] = reader->ReadNakedByte(i != 0);
                }
                reader->ReadSequenceEnd();
            }
        }